

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Flt_t * Gia_SimQualityImpact(Gia_Man_t *p,Vec_Int_t *vPat,Vec_Int_t *vRareCounts)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Vec_Wrd_t *pVVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Vec_Flt_t *pVVar8;
  float *__s;
  Vec_Wrd_t *p_00;
  word *pwVar9;
  Vec_Wrd_t *p_01;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int nWords;
  float fVar15;
  
  iVar2 = p->vCis->nSize;
  pVVar8 = (Vec_Flt_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar5 = iVar2;
  }
  pVVar8->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (float *)0x0;
  }
  else {
    __s = (float *)malloc((long)iVar5 << 2);
  }
  pVVar8->pArray = __s;
  pVVar8->nSize = iVar2;
  iVar12 = 0;
  memset(__s,0,(long)iVar2 * 4);
  nWords = (((int)(iVar2 + 1U) >> 6) + 1) - (uint)((iVar2 + 1U & 0x3f) == 0);
  p_00 = Vec_WrdStart(nWords * iVar2);
  iVar5 = vPat->nSize;
  if (iVar5 != p->vCis->nSize) {
    __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x71f,"Vec_Flt_t *Gia_SimQualityImpact(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  uVar14 = 0;
  while ((int)uVar14 < iVar5) {
    iVar5 = Vec_IntEntry(vPat,uVar14);
    pwVar9 = Vec_WrdEntryP(p_00,iVar12);
    if (iVar5 != 0) {
      Abc_TtFill(pwVar9,nWords);
    }
    uVar14 = uVar14 + 1;
    pwVar9[uVar14 >> 6] = pwVar9[uVar14 >> 6] ^ 1L << ((byte)uVar14 & 0x3f);
    iVar12 = iVar12 + nWords;
    iVar5 = vPat->nSize;
  }
  pVVar4 = p->vSimsPi;
  p->vSimsPi = p_00;
  p_01 = Gia_ManSimPatSim(p);
  p->vSimsPi = pVVar4;
  uVar14 = 0;
  do {
    if (vRareCounts->nSize <= (int)(uVar14 | 1)) {
      Vec_WrdFree(p_01);
      Vec_WrdFree(p_00);
      return pVVar8;
    }
    iVar5 = Vec_IntEntry(vRareCounts,uVar14);
    iVar12 = Vec_IntEntry(vRareCounts,uVar14 | 1);
    iVar6 = Abc_Lit2Var(iVar5);
    uVar7 = Abc_LitIsCompl(iVar5);
    pwVar9 = Vec_WrdEntryP(p_01,iVar6 * nWords);
    uVar13 = (uint)*pwVar9 & 1;
    if (uVar13 != 0) {
      Abc_TtNot(pwVar9,nWords);
    }
    fVar15 = 1.0 / (float)(iVar12 + 1);
    uVar3 = p->vCis->nSize;
    if (uVar13 == uVar7) {
      fVar15 = -fVar15;
    }
    uVar10 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar10 = 0;
    }
    uVar1 = 0;
    while (uVar11 = uVar1, uVar10 != uVar11) {
      uVar1 = uVar11 + 1;
      if ((pwVar9[uVar1 >> 6 & 0x3ffffff] >> (uVar1 & 0x3f) & 1) != 0) {
        if ((long)iVar2 <= (long)uVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                        ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
        }
        __s[uVar11] = __s[uVar11] + fVar15;
      }
    }
    uVar14 = uVar14 + 2;
  } while( true );
}

Assistant:

Vec_Flt_t * Gia_SimQualityImpact( Gia_Man_t * p, Vec_Int_t * vPat, Vec_Int_t * vRareCounts )
{
    Vec_Flt_t * vQuoIncs = Vec_FltStart( Gia_ManCiNum(p) );
    int nWordsNew = Abc_Bit6WordNum( 1+Gia_ManCiNum(p) );
    Vec_Wrd_t * vSimsPiNew = Vec_WrdStart( Gia_ManCiNum(p) * nWordsNew );
    Vec_Wrd_t * vTemp, * vSims;
    int i, k, Value, RareLit, RareCount;
    assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );
    Vec_IntForEachEntry( vPat, Value, i )
    {
        word * pSim = Vec_WrdEntryP( vSimsPiNew, i*nWordsNew );
        if ( Value )
            Abc_TtFill( pSim, nWordsNew );
        Abc_TtXorBit( pSim, i+1 );
    }
    vTemp = p->vSimsPi;
    p->vSimsPi = vSimsPiNew;
    vSims = Gia_ManSimPatSim( p );
    p->vSimsPi = vTemp;
    Vec_IntForEachEntryDouble( vRareCounts, RareLit, RareCount, i )
    {
        float Incrm = (float)1.0/(RareCount+1);
        int RareObj = Abc_Lit2Var(RareLit);
        int RareVal = Abc_LitIsCompl(RareLit);
        word * pSim = Vec_WrdEntryP( vSims, RareObj*nWordsNew );
        int OrigVal = pSim[0] & 1;
        if ( OrigVal )
            Abc_TtNot( pSim, nWordsNew );
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            if ( Abc_TtGetBit(pSim, k+1) ) // value changed
                Vec_FltAddToEntry( vQuoIncs, k, OrigVal != RareVal ? Incrm : -Incrm );
    }
    Vec_WrdFree( vSims );
    Vec_WrdFree( vSimsPiNew );
    return vQuoIncs;
}